

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodecTests.cc
# Opt level: O1

void avro::testStreamLifetimes(void)

{
  auto_ptr<avro::OutputStream> s1;
  EncoderPtr e;
  long *local_20;
  long *local_18;
  shared_count local_10;
  
  avro::binaryEncoder();
  avro::memoryOutputStream((ulong)&local_20);
  (**(code **)(*local_18 + 0x10))(local_18,local_20);
  (**(code **)(*local_18 + 0x30))(local_18,100);
  (**(code **)(*local_18 + 0x48))(0x4012eb851eb851ec);
  (**(code **)(*local_18 + 0x18))();
  if (local_20 != (long *)0x0) {
    (**(code **)(*local_20 + 8))();
  }
  avro::memoryOutputStream((ulong)&local_20);
  (**(code **)(*local_18 + 0x10))(local_18,local_20);
  (**(code **)(*local_18 + 0x48))(0x40091eb851eb851f);
  (**(code **)(*local_18 + 0x18))();
  if (local_20 != (long *)0x0) {
    (**(code **)(*local_20 + 8))();
  }
  boost::detail::shared_count::~shared_count(&local_10);
  return;
}

Assistant:

static void testStreamLifetimes()
{
    EncoderPtr e = binaryEncoder();
    {
        std::auto_ptr<OutputStream> s1 = memoryOutputStream();
        e->init(*s1);
        e->encodeInt(100);
        e->encodeDouble(4.73);
        e->flush();
    }

    {
        std::auto_ptr<OutputStream> s2 = memoryOutputStream();
        e->init(*s2);
        e->encodeDouble(3.14);
        e->flush();
    }

}